

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void threadFunc(int id,int numThreads,World *world,Tracer *tracer,Camera *camera,RGBColor *frame)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int startX;
  int tileHeight;
  int iVar5;
  
  iVar1 = (world->viewplane_).width_;
  iVar2 = (world->viewplane_).height_;
  iVar5 = iVar1 / 0x10 + 1;
  while( true ) {
    iVar3 = id / iVar5;
    iVar4 = id % iVar5;
    if (iVar2 / 0x10 < iVar3) break;
    startX = iVar4 * 0x10;
    iVar4 = iVar1 + iVar4 * -0x10;
    if (startX + 0x10 <= iVar1) {
      iVar4 = 0x10;
    }
    tileHeight = iVar2 + iVar3 * -0x10;
    if (iVar3 * 0x10 + 0x10 <= iVar2) {
      tileHeight = 0x10;
    }
    pm::Camera::renderScene(camera,world,tracer,frame,startX,iVar3 * 0x10,iVar4,tileHeight);
    id = id + numThreads;
  }
  return;
}

Assistant:

void threadFunc(int id, int numThreads, pm::World &world, pm::Tracer &tracer, pm::Camera &camera, pm::RGBColor *frame)
{
	const int width = world.viewPlane().width();
	const int height = world.viewPlane().height();
	const int numColumns = (width / TileSize) + 1;
	const int numRows = (height / TileSize) + 1;

	bool hasFinished = false;
	int iteration = 0;

	while (hasFinished == false)
	{
		const int index = (iteration * numThreads) + id;
		int column = index % numColumns;
		int row = index / numColumns;

		if (row > numRows - 1)
		{
			hasFinished = true;
			break;
		}

		const int startX = column * TileSize;
		const int startY = row * TileSize;
		const int tileSizeX = (startX + TileSize > width) ? width - startX : TileSize;
		const int tileSizeY = (startY + TileSize > height) ? height - startY : TileSize;

		camera.renderScene(world, tracer, frame, startX, startY, tileSizeX, tileSizeY);
		iteration++;
	}
}